

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quality_estimate.c
# Opt level: O3

int VP8EstimateQuality(uint8_t *data,size_t size)

{
  VP8StatusCode VVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  int q [4];
  WebPBitstreamFeatures features;
  int local_58 [4];
  WebPBitstreamFeatures local_48;
  
  if (data == (uint8_t *)0x0) {
    return -1;
  }
  VVar1 = WebPGetFeaturesInternal(data,size,&local_48,0x210);
  if (VVar1 == VP8_STATUS_OK) {
    if (local_48.format == 2) {
      return 0x65;
    }
    if ((local_48.format != 0) && (local_48.has_animation == 0)) {
      uVar7 = 0x22;
      uVar3 = 4;
      uVar5 = 0;
      while (uVar3 - size != 4) {
        uVar4 = uVar5 >> 8;
        lVar8 = uVar3 - 4;
        uVar5 = uVar4 | (ulong)data[lVar8] << 0x28;
        uVar7 = uVar7 + 8;
        uVar3 = uVar3 + 1;
        if ((uVar4 & 0xffffffffff000000 | (ulong)data[lVar8] << 0x28) == 0x2a019d000000) {
          if (size < uVar3) {
            return -1;
          }
          uVar3 = size << 3;
          if (uVar3 < uVar7) {
            uVar7 = 0x8000000000000000;
          }
          iVar9 = -1;
          if (uVar7 < uVar3) {
            uVar5 = uVar7 | 1;
            if ((char)(data[uVar7 >> 3] << ((byte)uVar7 & 6)) < '\0') {
              bVar11 = true;
              uVar4 = 0x8000000000000000;
              if (uVar7 + 2 <= uVar3) {
                bVar11 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar5 & 7));
                uVar4 = uVar7 + 2;
              }
              iVar9 = -1;
              if (uVar4 < uVar3) {
                uVar5 = uVar4 + 1;
                if ((char)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) < '\0') {
                  bVar12 = true;
                  uVar7 = 0x8000000000000000;
                  if (uVar4 + 2 <= uVar3) {
                    bVar12 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
                    uVar7 = uVar4 + 2;
                  }
                  local_58[0] = 0;
                  local_58[1] = 0;
                  local_58[2] = 0;
                  local_58[3] = 0;
                  lVar8 = 0;
                  do {
                    uVar5 = uVar7 + 1;
                    uVar4 = 0x8000000000000000;
                    if ((uVar5 <= uVar3) &&
                       (uVar4 = uVar5, (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) < '\0')) {
                      iVar9 = 0;
                      uVar10 = 0x8000000000000000;
                      if (uVar7 + 8 <= uVar3) {
                        iVar9 = 0;
                        lVar2 = -7;
                        do {
                          iVar9 = (uint)((byte)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) >> 7) +
                                  iVar9 * 2;
                          lVar2 = lVar2 + 1;
                          uVar5 = uVar5 + 1;
                          uVar10 = uVar7 + 8;
                        } while (lVar2 != 0);
                      }
                      local_58[lVar8] = iVar9;
                      uVar5 = uVar10 + 1;
                      uVar4 = 0x8000000000000000;
                      if ((uVar5 <= uVar3) &&
                         (uVar4 = uVar5, (char)(data[uVar10 >> 3] << ((byte)uVar10 & 7)) < '\0')) {
                        local_58[lVar8] = -iVar9;
                      }
                    }
                    lVar8 = lVar8 + 1;
                    uVar7 = uVar4;
                  } while (lVar8 != 4);
                  iVar9 = 4;
                  do {
                    uVar5 = 0x8000000000000000;
                    if (((uVar4 + 1 <= uVar3) &&
                        (uVar5 = uVar4 + 1, (char)(data[uVar4 >> 3] << ((byte)uVar4 & 7)) < '\0'))
                       && (uVar5 = uVar4 + 8, uVar3 < uVar5)) {
                      uVar5 = 0x8000000000000000;
                    }
                    iVar9 = iVar9 + -1;
                    uVar4 = uVar5;
                  } while (iVar9 != 0);
                  iVar9 = local_58[0];
                  if (bVar12) {
                    iVar9 = -1;
                  }
                }
              }
              else {
                uVar5 = 0x8000000000000000;
              }
              if (!bVar11) {
                iVar6 = 3;
                uVar7 = uVar5;
                do {
                  uVar5 = 0x8000000000000000;
                  if (((uVar7 + 1 <= uVar3) &&
                      (uVar5 = uVar7 + 1, (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) < '\0')) &&
                     (uVar5 = uVar7 + 9, uVar3 < uVar5)) {
                    uVar5 = 0x8000000000000000;
                  }
                  iVar6 = iVar6 + -1;
                  uVar7 = uVar5;
                } while (iVar6 != 0);
              }
            }
          }
          else {
            uVar5 = 0x8000000000000000;
          }
          uVar5 = uVar5 + 10;
          if (uVar3 < uVar5) {
            uVar5 = 0x8000000000000000;
          }
          uVar7 = uVar5 + 1;
          uVar4 = 0x8000000000000000;
          if ((uVar7 <= uVar3) &&
             (uVar4 = uVar7, (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) < '\0')) {
            uVar5 = uVar5 + 2;
            uVar4 = 0x8000000000000000;
            if ((uVar5 <= uVar3) &&
               (uVar4 = uVar5, (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) < '\0')) {
              iVar6 = 8;
              do {
                uVar7 = 0x8000000000000000;
                if (((uVar5 + 1 <= uVar3) &&
                    (uVar7 = uVar5 + 1, (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) < '\0')) &&
                   (uVar7 = uVar5 + 7, uVar3 < uVar5 + 7)) {
                  uVar7 = 0x8000000000000000;
                }
                uVar5 = uVar7;
                iVar6 = iVar6 + -1;
                uVar4 = uVar5;
              } while (iVar6 != 0);
            }
          }
          uVar4 = uVar4 + 2;
          if (uVar3 < uVar4) {
            uVar4 = 0x8000000000000000;
          }
          iVar6 = 0;
          uVar5 = 0x8000000000000000;
          if (uVar4 + 7 <= uVar3) {
            iVar6 = 0;
            lVar8 = -7;
            uVar7 = uVar4;
            do {
              iVar6 = (uint)((byte)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) >> 7) + iVar6 * 2;
              lVar8 = lVar8 + 1;
              uVar7 = uVar7 + 1;
              uVar5 = uVar4 + 7;
            } while (lVar8 != 0);
          }
          uVar7 = 0x8000000000000000;
          if (((uVar5 + 1 <= uVar3) &&
              (uVar7 = uVar5 + 1, (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) < '\0')) &&
             (uVar7 = uVar5 + 6, uVar3 < uVar7)) {
            uVar7 = 0x8000000000000000;
          }
          uVar5 = 0x8000000000000000;
          if (((uVar7 + 1 <= uVar3) &&
              (uVar5 = uVar7 + 1, (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) < '\0')) &&
             (uVar5 = uVar7 + 6, uVar3 < uVar5)) {
            uVar5 = 0x8000000000000000;
          }
          uVar7 = 0x8000000000000000;
          if (((uVar5 + 1 <= uVar3) &&
              (uVar7 = uVar5 + 1, (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) < '\0')) &&
             (uVar7 = uVar5 + 6, uVar3 < uVar7)) {
            uVar7 = 0x8000000000000000;
          }
          uVar5 = 0x8000000000000000;
          if (((uVar7 + 1 <= uVar3) &&
              (uVar5 = uVar7 + 1, (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7)) < '\0')) &&
             (uVar5 = uVar7 + 6, uVar3 < uVar5)) {
            uVar5 = 0x8000000000000000;
          }
          uVar7 = uVar5 + 1;
          if (uVar3 < uVar7) {
            return -1;
          }
          if (((char)(data[uVar5 >> 3] << ((byte)uVar5 & 7)) < '\0') &&
             (uVar7 = uVar5 + 6, uVar3 < uVar7)) {
            return -1;
          }
          if (uVar7 == 0x8000000000000000) {
            return -1;
          }
          if (-1 < iVar9) {
            iVar6 = iVar9;
          }
          iVar9 = ((0x7f - iVar6) * 100) / 0x7f;
          if (iVar6 < 0x1a) {
            return iVar9;
          }
          dVar13 = pow((double)iVar9 / 80.0,2.6315789473684212);
          return (int)(dVar13 * 80.0);
        }
      }
    }
  }
  return -1;
}

Assistant:

int VP8EstimateQuality(const uint8_t* const data, size_t size) {
  size_t pos = 0;
  uint64_t bit_pos;
  uint64_t sig = 0x00;
  int ok = 0;
  int Q = -1;
  WebPBitstreamFeatures features;

  if (data == NULL) return -1;

  if (WebPGetFeatures(data, size, &features) != VP8_STATUS_OK) {
    return -1;   // invalid file
  }
  if (features.format == 2) return 101;  // lossless
  if (features.format == 0 || features.has_animation) return -1;   // mixed

  while (pos < size) {
    sig = (sig >> 8) | ((uint64_t)data[pos++] << 40);
    if ((sig >> 24) == 0x2a019dull) {
      ok = 1;
      break;
    }
  }
  if (!ok) return -1;
  if (pos + 4 > size) return -1;

  // Skip main Header
  // width  = (data[pos + 0] | (data[pos + 1] << 8)) & 0x3fff;
  // height = (data[pos + 2] | (data[pos + 3] << 8)) & 0x3fff;
  pos += 4;
  bit_pos = pos * 8;

  GET_BIT(2);  // colorspace + clamp type

  // Segment header
  if (GET_BIT(1)) {       // use_segment
    int s;
    const int update_map = GET_BIT(1);
    if (GET_BIT(1)) {     // update data
      const int absolute_delta = GET_BIT(1);
      int q[4]  = { 0, 0, 0, 0 };
      for (s = 0; s < 4; ++s) {
        if (GET_BIT(1)) {
          q[s] = GET_BIT(7);
          if (GET_BIT(1)) q[s] = -q[s];   // sign
        }
      }
      if (absolute_delta) Q = q[0];  // just use the first segment's quantizer
      for (s = 0; s < 4; ++s) CONDITIONAL_SKIP(7);   //  filter strength
    }
    if (update_map) {
      for (s = 0; s < 3; ++s) CONDITIONAL_SKIP(8);
    }
  }
  // Filter header
  GET_BIT(1 + 6 + 3);     // simple + level + sharpness
  if (GET_BIT(1)) {       // use_lf_delta
    if (GET_BIT(1)) {     // update lf_delta?
      int n;
      for (n = 0; n < 4 + 4; ++n) CONDITIONAL_SKIP(6);
    }
  }
  // num partitions
  GET_BIT(2);

  // ParseQuant
  {
    const int base_q = GET_BIT(7);
    /* dqy1_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_ac = */ CONDITIONAL_SKIP(5);
    /* dquv_dc = */ CONDITIONAL_SKIP(5);
    /* dquv_ac = */ CONDITIONAL_SKIP(5);

    if (Q < 0) Q = base_q;
  }
  if (bit_pos == INVALID_BIT_POS) return -1;

  // base mapping
  Q = (127 - Q) * 100 / 127;
  // correction for power-law behavior in low range
  if (Q < 80) {
    Q = (int)(pow(Q / 80., 1. / 0.38) * 80);
  }
  return Q;
}